

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::Read3dmReferencedComponentIndex
          (ON_BinaryArchive *this,Type component_type,int *component_index)

{
  ON_2dex *pOVar1;
  ON_DimStyle *this_00;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ON_ComponentManifestItem *this_01;
  ON_ManifestMapItem *this_02;
  ON_Material *pOVar7;
  int archive_text_style_index;
  long lVar8;
  int archive_component_index;
  ON_UUID_struct *local_50;
  ON_ManifestMap *local_48;
  ON_UUID local_40;
  
  if (component_index != (int *)0x0) {
    *component_index = -0x7fffffff;
  }
  archive_component_index = -0x7fffffff;
  bVar3 = ReadInt(this,&archive_component_index);
  iVar2 = archive_component_index;
  if (!bVar3) {
    return bVar3;
  }
  lVar8 = (long)archive_component_index;
  iVar6 = iVar2;
  if ((lVar8 < 0) || (this->m_bReferencedComponentIndexMapping == false)) goto joined_r0x00547792;
  if (component_type == DimStyle) {
LAB_00547657:
    iVar5 = Archive3dmVersion(this);
    iVar6 = archive_component_index;
    if (iVar5 < 0x33) goto joined_r0x00547792;
    component_type = DimStyle;
    if (((-1 < (long)archive_component_index) &&
        (archive_component_index < (this->m_archive_dim_style_table).m_count)) &&
       (this_00 = (this->m_archive_dim_style_table).m_a[archive_component_index],
       this_00 != (ON_DimStyle *)0x0)) {
      bVar4 = ON_ModelComponent::ParentIdIsNotNil(&this_00->super_ON_ModelComponent);
      iVar6 = archive_component_index;
      if (bVar4) goto joined_r0x00547792;
      local_50 = &(this_00->super_ON_ModelComponent).m_component_id;
      this_01 = ON_ComponentManifest::ItemFromId
                          (&this->m_manifest,DimStyle,
                           (this_00->super_ON_ModelComponent).m_component_id);
      local_40 = ON_ComponentManifestItem::Id(this_01);
      bVar4 = ::operator==(&local_40,local_50);
      if (bVar4) {
        archive_component_index = ON_ComponentManifestItem::Index(this_01);
      }
    }
  }
  else if (component_type == TextStyle) {
    archive_component_index = -0x7fffffff;
    if ((iVar2 < (this->m_text_style_to_dim_style_archive_index_map).m_count) &&
       (pOVar1 = (this->m_text_style_to_dim_style_archive_index_map).m_a, iVar6 = pOVar1[lVar8].j,
       -1 < iVar6 && iVar2 == pOVar1[lVar8].i)) {
      archive_component_index = iVar6;
    }
    goto LAB_00547657;
  }
  local_48 = &this->m_manifest_map;
  local_50 = (ON_UUID_struct *)CONCAT44(local_50._4_4_,(uint)component_type);
  this_02 = ON_ManifestMap::MapItemFromSourceIndex(local_48,component_type,archive_component_index);
  bVar4 = ON_ManifestMapItem::SourceAndDestinationAreSet(this_02);
  if ((!bVar4) || (iVar6 = ON_ManifestMapItem::DestinationIndex(this_02), iVar6 == -0x7fffffff)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xbf6,"","Unable to update component index.");
    if (component_type != DimStyle) {
      if ((int)local_50 == 4) {
        pOVar7 = (ON_Material *)&ON_Linetype::Continuous;
      }
      else {
        iVar6 = iVar2;
        if ((int)local_50 != 3) goto joined_r0x00547792;
        pOVar7 = &ON_Material::Default;
      }
      iVar6 = (pOVar7->super_ON_ModelComponent).m_component_index;
      goto joined_r0x00547792;
    }
    iVar6 = iVar2;
    if (this->m_archive_current_dim_style == (ON_DimStyle *)0x0) goto joined_r0x00547792;
    this_02 = ON_ManifestMap::MapItemFromSourceIndex
                        (local_48,DimStyle,
                         (this->m_archive_current_dim_style->super_ON_ModelComponent).
                         m_component_index);
    bVar4 = ON_ManifestMapItem::SourceAndDestinationAreSet(this_02);
    if ((!bVar4) || (iVar5 = ON_ManifestMapItem::DestinationIndex(this_02), iVar5 == -0x7fffffff))
    goto joined_r0x00547792;
  }
  iVar6 = ON_ManifestMapItem::DestinationIndex(this_02);
joined_r0x00547792:
  if (component_index != (int *)0x0) {
    *component_index = iVar6;
  }
  return bVar3;
}

Assistant:

bool ON_BinaryArchive::Read3dmReferencedComponentIndex(
  ON_ModelComponent::Type component_type,
  int* component_index
  )
{
  if (nullptr != component_index)
    *component_index = ON_UNSET_INT_INDEX;

  int archive_component_index = ON_UNSET_INT_INDEX;
  if (!ReadInt(&archive_component_index))
    return false;
  
  if (archive_component_index < 0 || false == ReferencedComponentIndexMapping() )
  {
    // system component with a persistent negative index
    if (nullptr != component_index)
      *component_index = archive_component_index;
    return true;
  }

  int updated_component_index = archive_component_index;

  if (ON_ModelComponent::Type::TextStyle == component_type)
  {
    component_type = ON_ModelComponent::Type::DimStyle;
    const int archive_text_style_index = archive_component_index;
    archive_component_index = ON_UNSET_INT_INDEX;
    if (archive_text_style_index >= 0
      && archive_text_style_index < m_text_style_to_dim_style_archive_index_map.Count()
      )
    {
      const ON_2dex ts_to_ds = m_text_style_to_dim_style_archive_index_map[archive_text_style_index];
      if (archive_text_style_index == ts_to_ds.i && ts_to_ds.j >= 0)
      {
        archive_component_index = ts_to_ds.j;
      }
    }
  }

  if (ON_ModelComponent::Type::DimStyle == component_type)
  {
    if (this->Archive3dmVersion() <= 50)
    {
      if (nullptr != component_index)
        *component_index = archive_component_index;

      return true;
    }
    const int archive_dim_style_index = archive_component_index;
    if (archive_dim_style_index >= 0
      && archive_dim_style_index < m_archive_dim_style_table.Count()
      )
    {
      const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[archive_dim_style_index];
      if (nullptr != archive_dim_style)
      {
        if (archive_dim_style->ParentIdIsNotNil())
        {
          // override dimstyle - not in manifests or dimstyle table.
          if (nullptr != component_index)
            *component_index = archive_component_index;

          return true;
        }

        const ON_ComponentManifestItem& item = m_manifest.ItemFromId(ON_ModelComponent::Type::DimStyle,archive_dim_style->Id());
        if ( item.Id() == archive_dim_style->Id() )
        {
          archive_component_index = item.Index();
        }
      }
    }
  }

  const ON_ManifestMapItem& map_item = m_manifest_map.MapItemFromSourceIndex(component_type,archive_component_index);
  if (map_item.SourceAndDestinationAreSet() && ON_UNSET_INT_INDEX != map_item.DestinationIndex())
  {
    updated_component_index = map_item.DestinationIndex();
  }
  else
  {
    ON_ERROR("Unable to update component index.");

    // Get something that might work when possible
    switch (component_type)
    {
    case ON_ModelComponent::Type::Image:
      break;
    case ON_ModelComponent::Type::TextureMapping:
      break;
    case ON_ModelComponent::Type::Material:
      updated_component_index = ON_Material::Default.Index();
      break;
    case ON_ModelComponent::Type::LinePattern:
      updated_component_index = ON_Linetype::Continuous.Index();
      break;
    case ON_ModelComponent::Type::Layer:
      break;
    case ON_ModelComponent::Type::Group:
      break;

    case ON_ModelComponent::Type::TextStyle:
    case ON_ModelComponent::Type::DimStyle:
      if (nullptr != m_archive_current_dim_style)
      {
        const ON_ManifestMapItem& archive_current_dim_style_map_item = m_manifest_map.MapItemFromSourceIndex(ON_ModelComponent::Type::DimStyle,m_archive_current_dim_style->Index());
        if (archive_current_dim_style_map_item.SourceAndDestinationAreSet()
          && ON_UNSET_INT_INDEX != archive_current_dim_style_map_item.DestinationIndex()
          )
        {
          updated_component_index = archive_current_dim_style_map_item.DestinationIndex();
        }
      }
      break;

    case ON_ModelComponent::Type::RenderLight:
      break;
    case ON_ModelComponent::Type::HatchPattern:
      break;
    case ON_ModelComponent::Type::InstanceDefinition:
      break;
    case ON_ModelComponent::Type::ModelGeometry:
      break;
    case ON_ModelComponent::Type::HistoryRecord:
      break;
    default:
      break;
    }
  }

  if (nullptr != component_index)
    *component_index = updated_component_index;

  return true; // true indicates the read worked, even if the component index cannot be updated.
}